

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeRegularExpressionCommand.cxx
# Opt level: O3

bool __thiscall
cmIncludeRegularExpressionCommand::InitialPass
          (cmIncludeRegularExpressionCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = (ulong)((long)pbVar2 - (long)pbVar1) < 0x41;
  if (bVar3 && pbVar2 != pbVar1) {
    cmMakefile::SetIncludeRegularExpression
              ((this->super_cmCommand).Makefile,(pbVar1->_M_dataplus)._M_p);
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::_M_assign
                ((string *)&((this->super_cmCommand).Makefile)->ComplainFileRegularExpression);
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar3 && pbVar2 != pbVar1;
}

Assistant:

bool cmIncludeRegularExpressionCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if ((args.empty()) || (args.size() > 2)) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->Makefile->SetIncludeRegularExpression(args[0].c_str());

  if (args.size() > 1) {
    this->Makefile->SetComplainRegularExpression(args[1]);
  }

  return true;
}